

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

i64 sqlite3VdbeIntValue(Mem *pMem)

{
  ushort uVar1;
  Mem *local_28;
  i64 value;
  Mem *pMStack_18;
  int flags;
  Mem *pMem_local;
  
  uVar1 = pMem->flags;
  value._4_4_ = (uint)uVar1;
  if ((uVar1 & 4) == 0) {
    pMStack_18 = pMem;
    if ((uVar1 & 8) == 0) {
      if ((uVar1 & 0x12) == 0) {
        pMem_local = (Mem *)0x0;
      }
      else {
        local_28 = (Mem *)0x0;
        sqlite3Atoi64(pMem->z,(i64 *)&local_28,pMem->n,pMem->enc);
        pMem_local = local_28;
      }
    }
    else {
      pMem_local = (Mem *)doubleToInt64(pMem->r);
    }
  }
  else {
    pMem_local = (Mem *)(pMem->u).pDef;
  }
  return (i64)pMem_local;
}

Assistant:

SQLITE_PRIVATE i64 sqlite3VdbeIntValue(Mem *pMem){
  int flags;
  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( EIGHT_BYTE_ALIGNMENT(pMem) );
  flags = pMem->flags;
  if( flags & MEM_Int ){
    return pMem->u.i;
  }else if( flags & MEM_Real ){
    return doubleToInt64(pMem->r);
  }else if( flags & (MEM_Str|MEM_Blob) ){
    i64 value = 0;
    assert( pMem->z || pMem->n==0 );
    testcase( pMem->z==0 );
    sqlite3Atoi64(pMem->z, &value, pMem->n, pMem->enc);
    return value;
  }else{
    return 0;
  }
}